

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O3

value value_from(value v,void *data,size_t bytes)

{
  void *pvVar1;
  void *dest;
  
  if (bytes == 0 || v == (value)0x0) {
    return v;
  }
  if (data == (void *)0x0) {
    pvVar1 = memset(v,0,bytes);
    return pvVar1;
  }
  pvVar1 = memcpy(v,data,bytes);
  return pvVar1;
}

Assistant:

value value_from(value v, const void *data, size_t bytes)
{
	void *dest = value_data(v);

	if (dest != NULL && bytes > 0)
	{
		if (data != NULL)
		{
			memcpy(dest, data, bytes);
		}
		else
		{
			memset(dest, 0, bytes);
		}
	}

	return v;
}